

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.cpp
# Opt level: O2

void __thiscall
sequence_node_double_false_Test::sequence_node_double_false_Test
          (sequence_node_double_false_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001750c8;
  return;
}

Assistant:

TEST(sequence_node, double_false) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"sequence_node\">"
      "<bhvr_tree class = \"false_node\"/>"
      "<bhvr_tree class = \"false_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(0, agent->get_true_counter());
    EXPECT_EQ(1, agent->get_false_counter());
  });
}